

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>
helics::make_filter(FilterTypes type,CoreApp *core,string_view name)

{
  tuple<helics::Filter_*,_std::default_delete<helics::Filter>_> in_RDI;
  Core *in_R8;
  string_view in_stack_00000000;
  CoreApp *in_stack_ffffffffffffff88;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_38 [2];
  __uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_> _Var1;
  FilterTypes type_00;
  
  _Var1._M_t.super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
  super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl =
       (tuple<helics::Filter_*,_std::default_delete<helics::Filter>_>)
       (tuple<helics::Filter_*,_std::default_delete<helics::Filter>_>)
       in_RDI.super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
       super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
  CoreApp::getCopyofCorePointer(in_stack_ffffffffffffff88);
  type_00 = _Var1._M_t.
            super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
            super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl._4_4_;
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(local_38);
  make_filter(type_00,in_R8,in_stack_00000000);
  std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x2cbc90);
  return (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         (__uniq_ptr_data<helics::Filter,_std::default_delete<helics::Filter>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Filter> make_filter(FilterTypes type, CoreApp& core, std::string_view name)
{
    return make_filter(type, core.getCopyofCorePointer().get(), name);
}